

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O1

uint __thiscall
ON_SubDMeshFragmentIterator::TotalPointCount(ON_SubDMeshFragmentIterator *this,uint mesh_density)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  
  uVar1 = ClampMeshDensity(this,mesh_density);
  uVar2 = FragmentCount(this);
  uVar4 = uVar2;
  if (uVar2 != 0) {
    uVar2 = this->m_full_size_fragment_count;
    uVar4 = this->m_half_size_fragment_count;
  }
  iVar5 = (1 << ((byte)uVar1 & 0x1f)) + 1;
  iVar5 = iVar5 * iVar5;
  if (6 < uVar1) {
    iVar5 = 0;
  }
  iVar3 = (1 << ((byte)(uVar1 - 1) & 0x1f)) + 1;
  iVar3 = iVar3 * iVar3;
  if (5 < uVar1 - 1) {
    iVar3 = 0;
  }
  return iVar3 * uVar4 + iVar5 * uVar2;
}

Assistant:

unsigned int ON_SubDMeshFragmentIterator::TotalPointCount(
  unsigned int mesh_density
  ) const
{
  mesh_density = ClampMeshDensity(mesh_density);
  unsigned int full_size_fragment_count = 0;
  unsigned int half_size_fragment_count = 0;
  ON_SubDMeshFragmentIterator::GetFragmentCounts(full_size_fragment_count, half_size_fragment_count);
  // const unsigned int grid_side_count = 1 << mesh_density;
  const unsigned int full_size_point_count = ON_SubDMeshFragment::FullFragmentMeshPointCountFromDensity(mesh_density);
  const unsigned int half_size_point_count = ON_SubDMeshFragment::HalfFragmentMeshPointCountFromDensity(mesh_density);
  return full_size_fragment_count * full_size_point_count + half_size_fragment_count * half_size_point_count;
}